

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O2

_Bool monster_change_shape(monster_conflict *mon)

{
  player_upkeep *ppVar1;
  _Bool _Var2;
  uint32_t uVar3;
  int iVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  monster_race *pmVar8;
  monster_spell *pmVar9;
  monster_race *pmVar10;
  uint uVar11;
  monster_shape *pmVar12;
  bool bVar13;
  source sVar14;
  source origin;
  bitflag summon_spells [12];
  
  pmVar12 = mon->race->shapes;
  if (pmVar12 == (monster_shape *)0x0) {
    uVar3 = 0;
    create_mon_spell_mask(summon_spells,0x400,0);
    flag_inter(summon_spells,mon->race->spell_flags,0xc);
    iVar4 = 1;
    while( true ) {
      iVar4 = flag_next(summon_spells,0xc,iVar4);
      if (iVar4 == 0) break;
      uVar3 = uVar3 + 1;
      iVar4 = iVar4 + 1;
    }
    uVar5 = Rand_div(uVar3);
    wVar6 = flag_next(summon_spells,0xc,1);
    uVar3 = 0;
    if (0 < (int)uVar5) {
      uVar3 = uVar5;
    }
    while (bVar13 = uVar3 != 0, uVar3 = uVar3 - 1, bVar13) {
      wVar6 = flag_next(summon_spells,0xc,wVar6);
    }
    pmVar9 = monster_spell_by_index(wVar6);
    wVar6 = pmVar9->effect->subtype;
    wVar7 = summon_name_to_idx("KIN");
    if (wVar6 == wVar7) {
      kin_base = mon->race->base;
    }
    pmVar8 = select_shape((monster *)mon,wVar6);
  }
  else {
    uVar3 = Rand_div(mon->race->num_shapes);
    while (bVar13 = uVar3 != 0, uVar3 = uVar3 - 1, bVar13) {
      pmVar12 = pmVar12->next;
    }
    pmVar8 = pmVar12->race;
    if (pmVar8 == (monster_race *)0x0) {
      shape_base = pmVar12->base;
      get_mon_num_prep(monster_base_shape_okay);
      pmVar8 = get_mon_num(player->depth + L'\x05',(int)player->depth);
      get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    }
  }
  _Var2 = monster_is_obvious((monster *)mon);
  if (_Var2) {
    monster_desc((char *)summon_spells,0x50,(monster *)mon,L'̔');
    msgt(0,"%s %s",summon_spells,"shimmers and changes!");
    ppVar1 = player->upkeep;
    uVar11 = ppVar1->redraw | 0x200;
    if ((monster_conflict *)ppVar1->health_who != mon) {
      uVar11 = ppVar1->redraw;
    }
    ppVar1->redraw = uVar11 | 0x400000;
    square_light_spot((chunk *)cave,mon->grid);
  }
  if (pmVar8 != (monster_race *)0x0) {
    pmVar10 = mon->original_race;
    if (pmVar10 == (monster_race *)0x0) {
      pmVar10 = mon->race;
      mon->original_race = pmVar10;
    }
    mon->race = pmVar8;
    mon->mspeed = mon->mspeed + ((char)pmVar8->speed - (char)pmVar10->speed);
  }
  _Var2 = monster_passes_walls((monster *)mon);
  if (!_Var2) {
    _Var2 = square_is_monster_walkable(cave,mon->grid);
    if (!_Var2) {
      sVar14 = source_monster(mon->midx);
      origin.which = sVar14.which;
      origin._4_4_ = 0;
      origin.what = sVar14.what;
      effect_simple(L':',origin,"1",L'\0',L'\0',L'\0',(mon->grid).y,(mon->grid).x,(_Bool *)0x0);
    }
  }
  return mon->original_race != (monster_race *)0x0;
}

Assistant:

bool monster_change_shape(struct monster *mon)
{
	struct monster_shape *shape = mon->race->shapes;
	struct monster_race *race = NULL;

	/* Use the monster's preferred shapes if any */
	if (shape) {
		/* Pick one */
		int choice = randint0(mon->race->num_shapes);
		while (choice--) {
			shape = shape->next;
		}

		/* Race or base? */
		if (shape->race) {
			/* Simple */
			race = shape->race;
		} else {
			/* Set the shape base */
			shape_base = shape->base;

			/* Choose a race of the given base */
			get_mon_num_prep(monster_base_shape_okay);

			/* Pick a random race */
			race = get_mon_num(player->depth + 5, player->depth);

			/* Reset allocation table */
			get_mon_num_prep(NULL);
		}
	} else {
		/* Choose something the monster can summon */
		bitflag summon_spells[RSF_SIZE];
		int i, poss = 0, which, index, summon_type;
		const struct monster_spell *spell;

		/* Extract the summon spells */
		create_mon_spell_mask(summon_spells, RST_SUMMON, RST_NONE);
		rsf_inter(summon_spells, mon->race->spell_flags);

		/* Count possibilities */
		for (i = rsf_next(summon_spells, FLAG_START); i != FLAG_END;
			 i = rsf_next(summon_spells, i + 1)) {
			poss++;
		}

		/* Pick one */
		which = randint0(poss);
		index = rsf_next(summon_spells, FLAG_START);
		for (i = 0; i < which; i++) {
			index = rsf_next(summon_spells, index);
		}
		spell = monster_spell_by_index(index);

		/* Set the summon type, and the kin_base if necessary */
		summon_type = spell->effect->subtype;
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Choose a race */
		race = select_shape(mon, summon_type);
	}

	/* Print a message immediately, update visuals */
	if (monster_is_obvious(mon)) {
		char m_name[80];
		monster_desc(m_name, sizeof(m_name), mon, MDESC_STANDARD);
		msgt(MSG_GENERIC, "%s %s", m_name, "shimmers and changes!");
		if (player->upkeep->health_who == mon)
			player->upkeep->redraw |= (PR_HEALTH);

		player->upkeep->redraw |= (PR_MONLIST);
		square_light_spot(cave, mon->grid);
	}

	/* Set the race */
	if (race) {
		if (!mon->original_race) mon->original_race = mon->race;
		mon->race = race;
		mon->mspeed += mon->race->speed - mon->original_race->speed;
	}

	/* Emergency teleport if needed */
	if (!monster_passes_walls(mon) &&
		!square_is_monster_walkable(cave, mon->grid)) {
		effect_simple(EF_TELEPORT, source_monster(mon->midx), "1", 0, 0, 0,
					  mon->grid.y, mon->grid.x, NULL);
	}

	return mon->original_race != NULL;
}